

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

string * units::clean_unit_string
                   (string *__return_storage_ptr__,string *propUnitString,uint32_t commodity)

{
  __tuple_element_t<0UL,_tuple<const_char_*,_const_char_*,_int,_int>_> pcVar1;
  bool bVar2;
  int iVar3;
  __tuple_element_t<0UL,_tuple<const_char_*,_const_char_*,_int,_int>_> *ppcVar4;
  __tuple_element_t<2UL,_tuple<const_char_*,_const_char_*,_int,_int>_> *p_Var5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  string *psVar9;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t commodity_00;
  char cVar10;
  precise_unit pVar11;
  undefined1 auVar12 [12];
  uint local_174;
  size_type locp_1;
  precise_unit rs_2;
  size_type loc_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d8 [8];
  precise_unit rs_1;
  size_type locp;
  precise_unit rs;
  size_type loc;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  undefined8 local_98 [3];
  undefined1 local_80 [8];
  string cString;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  undefined8 local_50;
  ulong local_48;
  size_type fnd;
  value_type *pseq;
  const_iterator __end1;
  const_iterator __begin1;
  array<std::tuple<const_char_*,_const_char_*,_int,_int>,_11UL> *__range1;
  string *psStack_18;
  uint32_t commodity_local;
  string *propUnitString_local;
  
  __begin1 = clean_unit_string::powerseq._M_elems;
  __range1._4_4_ = commodity;
  psStack_18 = propUnitString;
  propUnitString_local = __return_storage_ptr__;
  __end1 = std::array<std::tuple<const_char_*,_const_char_*,_int,_int>,_11UL>::begin
                     (&clean_unit_string::powerseq);
  pseq = std::array<std::tuple<const_char_*,_const_char_*,_int,_int>,_11UL>::end
                   (&clean_unit_string::powerseq);
  for (; __end1 != pseq; __end1 = __end1 + 1) {
    fnd = (size_type)__end1;
    ppcVar4 = std::get<0ul,char_const*,char_const*,int,int>(__end1);
    local_48 = std::__cxx11::string::find((char *)propUnitString,(ulong)*ppcVar4);
    while (uVar8 = local_48, local_48 != 0xffffffffffffffff) {
      p_Var5 = std::get<2ul,char_const*,char_const*,int,int>
                         ((tuple<const_char_*,_const_char_*,_int,_int> *)fnd);
      iVar3 = *p_Var5;
      std::get<1ul,char_const*,char_const*,int,int>
                ((tuple<const_char_*,_const_char_*,_int,_int> *)fnd);
      std::__cxx11::string::replace((ulong)propUnitString,uVar8,(char *)(long)iVar3);
      ppcVar4 = std::get<0ul,char_const*,char_const*,int,int>
                          ((tuple<const_char_*,_const_char_*,_int,_int> *)fnd);
      pcVar1 = *ppcVar4;
      std::get<3ul,char_const*,char_const*,int,int>
                ((tuple<const_char_*,_const_char_*,_int,_int> *)fnd);
      local_48 = std::__cxx11::string::find((char *)propUnitString,(ulong)pcVar1);
    }
  }
  auVar12 = std::__cxx11::string::empty();
  commodity_00 = auVar12._8_4_;
  cVar10 = (char)propUnitString;
  if ((auVar12 & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
    pcVar6 = (char *)std::__cxx11::string::front();
    if (((*pcVar6 == '(') && (pcVar6 = (char *)std::__cxx11::string::back(), *pcVar6 == ')')) &&
       (lVar7 = std::__cxx11::string::find_first_of(cVar10,0x28), lVar7 == -1)) {
      std::__cxx11::string::pop_back();
      local_58._M_current = (char *)std::__cxx11::string::begin();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_50,&local_58);
      cString.field_2._8_8_ = std::__cxx11::string::erase(propUnitString,local_50);
    }
    lVar7 = std::__cxx11::string::find((char *)propUnitString,0x1f6538);
    if (lVar7 != -1) {
      reduce_number_length(propUnitString,'0');
    }
    auVar12 = std::__cxx11::string::find((char *)propUnitString,0x1f6247);
    commodity_00 = auVar12._8_4_;
    if (auVar12._0_8_ != -1) {
      reduce_number_length(propUnitString,'9');
      commodity_00 = extraout_EDX;
    }
  }
  if (__range1._4_4_ == 0) {
    auVar12 = std::__cxx11::string::empty();
    commodity_00 = auVar12._8_4_;
    if ((auVar12 & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
      pcVar6 = (char *)std::__cxx11::string::front();
      bVar2 = isDigitCharacter(*pcVar6);
      commodity_00 = extraout_EDX_00;
      if (!bVar2) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)propUnitString);
        return __return_storage_ptr__;
      }
    }
  }
  if (__range1._4_4_ != 0) {
    if ((__range1._4_4_ & 0x80000000) == 0) {
      local_174 = __range1._4_4_;
    }
    else {
      local_174 = __range1._4_4_ ^ 0xffffffff;
    }
    getCommodityName_abi_cxx11_((string *)local_80,(units *)(ulong)local_174,commodity_00);
    iVar3 = std::__cxx11::string::compare((ulong)local_80,0,(char *)0x7);
    if (iVar3 != 0) {
      escapeString((string *)local_80);
    }
    local_a0._M_current = (char *)std::__cxx11::string::begin();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)local_98,&local_a0);
    std::__cxx11::string::insert(local_80,local_98[0],0x7b);
    std::__cxx11::string::push_back((char)local_80);
    if ((__range1._4_4_ & 0x80000000) == 0) {
      rs._8_8_ = std::__cxx11::string::find_last_of((char *)propUnitString,0x1fab97);
      if (rs._8_8_ == -1) {
        std::__cxx11::string::operator+=((string *)propUnitString,(string *)local_80);
      }
      else {
        iVar3 = std::__cxx11::string::compare((ulong)propUnitString,0,(char *)0x2);
        if (iVar3 == 0) {
          pVar11 = checkForCustomUnit((string *)local_80);
          rs.multiplier_ = pVar11._8_8_;
          locp = (size_type)pVar11.multiplier_;
          bVar2 = is_error((precise_unit *)&locp);
          if (!bVar2) {
            std::__cxx11::string::insert((ulong)local_80,0,'\x01');
          }
          std::__cxx11::string::c_str();
          std::__cxx11::string::replace((ulong)propUnitString,0,(char *)0x1);
        }
        else {
          rs_1._8_8_ = std::__cxx11::string::find_first_of((char *)propUnitString,0x1f6255);
          pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)propUnitString);
          if ((*pcVar6 == '^') &&
             (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)propUnitString),
             *pcVar6 == '-')) {
            pVar11 = checkForCustomUnit((string *)local_80);
            rs_1.multiplier_ = pVar11._8_8_;
            local_d8 = (undefined1  [8])pVar11.multiplier_;
            bVar2 = is_error((precise_unit *)local_d8);
            if (!bVar2) {
              std::__cxx11::string::insert((ulong)local_80,0,'\x01');
            }
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &loc_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_80,"*");
            std::operator+(&local_f8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &loc_1,propUnitString);
            std::__cxx11::string::operator=((string *)propUnitString,(string *)&local_f8);
            std::__cxx11::string::~string((string *)&local_f8);
            std::__cxx11::string::~string((string *)&loc_1);
          }
          else {
            std::__cxx11::string::insert((ulong)propUnitString,(string *)rs_1._8_8_);
          }
        }
      }
    }
    else {
      rs_2._8_8_ = std::__cxx11::string::find_last_of(cVar10,0x2f);
      if (rs_2._8_8_ == -1) {
        pVar11 = checkForCustomUnit((string *)local_80);
        rs_2.multiplier_ = pVar11._8_8_;
        locp_1 = (size_type)pVar11.multiplier_;
        bVar2 = is_error((precise_unit *)&locp_1);
        if (!bVar2) {
          std::__cxx11::string::insert((ulong)local_80,0,'\x01');
        }
        uVar8 = std::__cxx11::string::empty();
        if ((uVar8 & 1) != 0) {
          std::__cxx11::string::push_back(cVar10);
        }
        std::__cxx11::string::push_back(cVar10);
        std::__cxx11::string::append((string *)propUnitString);
      }
      else {
        psVar9 = (string *)std::__cxx11::string::find_last_of((char *)propUnitString,0x1f6259);
        if ((psVar9 == (string *)0xffffffffffffffff) || (psVar9 < (ulong)rs_2._8_8_)) {
          std::__cxx11::string::append((string *)propUnitString);
        }
        else {
          std::__cxx11::string::insert((ulong)propUnitString,psVar9);
        }
      }
    }
    std::__cxx11::string::~string((string *)local_80);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)propUnitString);
  return __return_storage_ptr__;
}

Assistant:

static std::string
    clean_unit_string(std::string propUnitString, std::uint32_t commodity)
{
    using spair = std::tuple<const char*, const char*, int, int>;
    static UNITS_CPP14_CONSTEXPR_OBJECT std::array<spair, 11> powerseq{
        {spair{"Mm^3", "(1e9km^3)", 4, 8},  // this needs to happen before ^3^2
                                            // conversions
         spair{"^2^2", "^4", 4, 2},
         spair{"^3^2", "^6", 4, 2},
         spair{"^2^3", "^6", 4, 2},
         spair{"^3^3", "^9", 4, 2},  // this can only happen with extended units
         spair{"Gs", "Bs", 2, 2},
         spair{"*K^", "*1*K^", 3, 5},  // this one is to prevent the next from
                                       // screwing things up
         spair{"eflag*K", "degC", 7, 4},
         spair{"*1*", "*", 3, 1},
         spair{"*1/", "/", 3, 1},
         spair{"*/", "/", 2, 1}}};
    // run a few checks for unusual conditions
    for (const auto& pseq : powerseq) {
        auto fnd = propUnitString.find(std::get<0>(pseq));
        while (fnd != std::string::npos) {
            propUnitString.replace(fnd, std::get<2>(pseq), std::get<1>(pseq));
            fnd =
                propUnitString.find(std::get<0>(pseq), fnd + std::get<3>(pseq));
        }
    }

    if (!propUnitString.empty()) {
        if (propUnitString.front() == '(' && propUnitString.back() == ')') {
            if (propUnitString.find_first_of('(', 1) == std::string::npos) {
                propUnitString.pop_back();
                propUnitString.erase(propUnitString.begin());
            }
        }
        if (propUnitString.find("00000") != std::string::npos) {
            reduce_number_length(propUnitString, '0');
        }
        if (propUnitString.find("99999") != std::string::npos) {
            reduce_number_length(propUnitString, '9');
        }
    }

    // no more cleaning necessary
    if (commodity == 0 && !propUnitString.empty() &&
        !isDigitCharacter(propUnitString.front())) {
        return propUnitString;
    }

    if (commodity != 0) {
        std::string cString = getCommodityName(
            ((commodity & 0x80000000) == 0) ? commodity : (~commodity));
        if (cString.compare(0, 7, "CXCOMM[") != 0) {
            // add some escapes for problematic sequences
            escapeString(cString);
        }
        // make it look like a commodity sequence
        cString.insert(cString.begin(), '{');
        cString.push_back('}');
        if ((commodity & 0x80000000) == 0) {
            auto loc = propUnitString.find_last_of("/^");
            if (loc == std::string::npos) {
                propUnitString += cString;
            } else if (propUnitString.compare(0, 2, "1/") == 0) {
                auto rs = checkForCustomUnit(cString);
                if (!is_error(rs)) {
                    cString.insert(0, 1, '1');
                }
                propUnitString.replace(0, 1, cString.c_str());
            } else {
                auto locp = propUnitString.find_first_of("^*/");
                if (propUnitString[locp] != '^' ||
                    propUnitString[locp + 1] != '-') {
                    propUnitString.insert(locp, cString);
                } else {
                    auto rs = checkForCustomUnit(cString);
                    if (!is_error(rs)) {
                        // this condition would take a very particular and odd
                        // string to trigger I haven't figured out a test case
                        // for it yet

                        // LCOV_EXCL_START
                        cString.insert(0, 1, '1');
                        // LCOV_EXCL_STOP
                    }
                    propUnitString = cString + "*" + propUnitString;
                }
            }
        } else {  // inverse commodity
            auto loc = propUnitString.find_last_of('/');
            if (loc == std::string::npos) {
                auto rs = checkForCustomUnit(cString);
                if (!is_error(rs)) {  // this check is needed because it is
                                      // possible to define a commodity that
                                      // would look like a form
                    // of custom unit
                    // The '1' forces the interpreter to interpret it as purely
                    // a commodity, but is only needed in very particular
                    // circumstances
                    cString.insert(0, 1, '1');
                }
                if (propUnitString.empty()) {
                    propUnitString.push_back('1');
                }
                propUnitString.push_back('/');
                propUnitString.append(cString);
            } else {
                auto locp = propUnitString.find_last_of("^*");
                if (locp == std::string::npos || locp < loc) {
                    propUnitString.append(cString);
                } else {
                    propUnitString.insert(locp, cString);
                }
            }
        }
    }
    return propUnitString;
}